

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

void check_waitpid_and_exit(pid_t pid)

{
  __pid_t _Var1;
  int iVar2;
  int in_register_00000004;
  int status;
  
  if (0 < pid) {
    status = in_register_00000004;
    do {
      _Var1 = waitpid(pid,&status,0);
    } while (_Var1 == -1);
    iVar2 = waserror(status,0);
    if (iVar2 != 0) {
      exit(1);
    }
  }
  exit(0);
}

Assistant:

void check_waitpid_and_exit(pid_t pid CK_ATTRIBUTE_UNUSED)
{
#if defined(HAVE_FORK) && HAVE_FORK==1
    pid_t pid_w;
    int status;

    if(pid > 0)
    {
        do
        {
            pid_w = waitpid(pid, &status, 0);
        }
        while(pid_w == -1);
        if(waserror(status, 0))
        {
            exit(EXIT_FAILURE);
        }
    }
    exit(EXIT_SUCCESS);
#else /* HAVE_FORK */
    /* Ignoring, as Check is not compiled with fork support. */
    exit(EXIT_FAILURE);
#endif /* HAVE_FORK */
}